

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Tracer.cpp
# Opt level: O1

Type1CharString * __thiscall
CharStringType1Tracer::GetSubr(CharStringType1Tracer *this,long inSubrIndex)

{
  int iVar1;
  undefined4 extraout_var;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"callsubr","");
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  iVar1 = (*(this->mHelper->super_Type1InterpreterImplementationAdapter).
            super_IType1InterpreterImplementation._vptr_IType1InterpreterImplementation[8])
                    (this->mHelper,inSubrIndex);
  return (Type1CharString *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Type1CharString* CharStringType1Tracer::GetSubr(long inSubrIndex)
{
	mPrimitiveWriter.WriteKeyword("callsubr");
	return mHelper->GetSubr(inSubrIndex);
}